

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<char> * __thiscall irr::core::string<char>::operator=(string<char> *this,string<char> *other)

{
  char *pcVar1;
  s32 i;
  long lVar2;
  int iVar3;
  
  if (this != other) {
    if (this->array != (char *)0x0) {
      operator_delete__(this->array);
    }
    iVar3 = other->used;
    this->used = iVar3;
    this->allocated = iVar3;
    pcVar1 = (char *)operator_new__((long)iVar3);
    this->array = pcVar1;
    pcVar1 = other->array;
    for (lVar2 = 0; lVar2 < iVar3; lVar2 = lVar2 + 1) {
      this->array[lVar2] = pcVar1[lVar2];
      iVar3 = this->used;
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const string<T>& other) 
	{
		if (this == &other)
			return *this;

		delete [] array;
		allocated = used = other.size()+1;
		array = new T[used];

		const T* p = other.c_str();
		for (s32 i=0; i<used; ++i, ++p)
			array[i] = *p;

		return *this;
	}